

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontMatrix.cpp
# Opt level: O1

void __thiscall
TPZParFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
::AddKel(TPZParFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
         *this,TPZFMatrix<std::complex<float>_> *elmat,TPZVec<long> *sourceindex,
        TPZVec<long> *destinationindex)

{
  TPZFrontSym<std::complex<float>_> *this_00;
  int iVar1;
  DecomposeType DVar2;
  TPZEqnArray<std::complex<float>_> *this_01;
  ostream *poVar3;
  int64_t maxeq;
  int64_t mineq;
  long local_38;
  long local_30;
  
  this_00 = &(this->
             super_TPZFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
             ).fFront;
  TPZFrontSym<std::complex<float>_>::AddKel(this_00,elmat,sourceindex,destinationindex);
  TPZFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
  ::EquationsToDecompose
            (&this->
              super_TPZFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
             ,destinationindex,&local_30,&local_38);
  if (local_30 <= local_38) {
    this_01 = (TPZEqnArray<std::complex<float>_> *)operator_new(0x3290);
    TPZEqnArray<std::complex<float>_>::TPZEqnArray(this_01);
    TPZFrontSym<std::complex<float>_>::DecomposeEquations(this_00,local_30,local_38,this_01);
    TPZFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
    ::CheckCompress(&this->
                     super_TPZFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
                   );
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->fwritelock);
    if (iVar1 != 0) {
      std::__throw_system_error(iVar1);
    }
    (*(this->fEqnStack).super_TPZManVector<TPZEqnArray<std::complex<float>_>_*,_10>.
      super_TPZVec<TPZEqnArray<std::complex<float>_>_*>._vptr_TPZVec[3])
              (&this->fEqnStack,
               (this->fEqnStack).super_TPZManVector<TPZEqnArray<std::complex<float>_>_*,_10>.
               super_TPZVec<TPZEqnArray<std::complex<float>_>_*>.fNElements + 1);
    (this->fEqnStack).super_TPZManVector<TPZEqnArray<std::complex<float>_>_*,_10>.
    super_TPZVec<TPZEqnArray<std::complex<float>_>_*>.fStore
    [(this->fEqnStack).super_TPZManVector<TPZEqnArray<std::complex<float>_>_*,_10>.
     super_TPZVec<TPZEqnArray<std::complex<float>_>_*>.fNElements + -1] = this_01;
    if (local_38 ==
        (this->
        super_TPZFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
        ).super_TPZAbstractFrontMatrix<std::complex<float>_>.super_TPZMatrix<std::complex<float>_>.
        super_TPZBaseMatrix.fRow + -1) {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
      std::ostream::put(-0x58);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Decomposition finished",0x16);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      std::ostream::flush();
      FinishWriting(this);
      TPZFrontSym<std::complex<float>_>::Reset(this_00,0);
    }
    std::condition_variable::notify_all();
    pthread_mutex_unlock((pthread_mutex_t *)&this->fwritelock);
  }
  DVar2 = TPZFrontSym<std::complex<float>_>::GetDecomposeType(this_00);
  (this->
  super_TPZFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
  ).super_TPZAbstractFrontMatrix<std::complex<float>_>.super_TPZMatrix<std::complex<float>_>.
  super_TPZBaseMatrix.fDecomposed = (char)DVar2;
  return;
}

Assistant:

void TPZParFrontMatrix<TVar, store, front>::AddKel(TPZFMatrix<TVar> & elmat, TPZVec < int64_t > & sourceindex, TPZVec < int64_t > & destinationindex)
{
	this->fFront.AddKel(elmat, sourceindex, destinationindex);
#ifdef PZ_LOG
    if (loggerfw.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "Frondwidth after AddKel "<< this->fFront.FrontSize();
		LOGPZ_DEBUG(loggerfw,sout.str())
	}
#endif
	int64_t mineq, maxeq;
	this->EquationsToDecompose(destinationindex, mineq, maxeq);

	if(maxeq >= mineq) {
		TPZEqnArray<TVar> *AuxEqn = new TPZEqnArray<TVar>;

		this->fFront.DecomposeEquations(mineq,maxeq,*AuxEqn);
		this->CheckCompress();
        std::lock_guard<std::mutex> lock(fwritelock);
		fEqnStack.Push(AuxEqn);
		if(maxeq == this->Rows()-1){
            //check if writeing is over and closes file
			cout << endl << "Decomposition finished" << endl;
			cout.flush();
			FinishWriting();
			this->fFront.Reset(0);
			//fStorage.ReOpen();
		}
        fwritecond.notify_all();
	}
	this->fDecomposed = this->fFront.GetDecomposeType();
}